

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# z-util.c
# Opt level: O1

uint32_t djb2_hash(char *str)

{
  uint32_t uVar1;
  char cVar2;
  char *pcVar3;
  
  cVar2 = *str;
  if (cVar2 != '\0') {
    pcVar3 = str + 1;
    uVar1 = 0x1505;
    do {
      uVar1 = uVar1 * 0x21 + (int)cVar2;
      cVar2 = *pcVar3;
      pcVar3 = pcVar3 + 1;
    } while (cVar2 != '\0');
    return uVar1;
  }
  return 0x1505;
}

Assistant:

uint32_t djb2_hash(const char *str)
{
	uint32_t hash = 5381;
	int c = *str;

	while (c)
	{
		hash = ((hash << 5) + hash) + c; /* hash * 33 + c */
		c = *++str;
	}

	return hash;
}